

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

void __thiscall icu_63::UnicodeSet::setPattern(UnicodeSet *this,UnicodeString *newPat)

{
  short sVar1;
  UChar *dst;
  uint uVar2;
  uint uVar3;
  uint start;
  
  if (this->pat != (char16_t *)0x0) {
    uprv_free_63(this->pat);
    this->pat = (char16_t *)0x0;
    this->patLen = 0;
  }
  sVar1 = (newPat->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = (newPat->fUnion).fFields.fLength;
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  dst = (UChar *)uprv_malloc_63((long)(int)uVar3 * 2 + 2);
  this->pat = dst;
  if (dst != (UChar *)0x0) {
    this->patLen = uVar3;
    sVar1 = (newPat->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar2 = (newPat->fUnion).fFields.fLength;
    }
    else {
      uVar2 = (int)sVar1 >> 5;
    }
    start = (int)uVar2 >> 0x1f & uVar2;
    if ((int)uVar3 <= (int)uVar2) {
      uVar2 = uVar3;
    }
    if ((int)uVar3 < 0) {
      uVar2 = 0;
    }
    UnicodeString::doExtract(newPat,start,uVar2 - start,dst,0);
    this->pat[this->patLen] = L'\0';
  }
  return;
}

Assistant:

void UnicodeSet::setPattern(const UnicodeString& newPat) {
    releasePattern();
    int32_t newPatLen = newPat.length();
    pat = (UChar *)uprv_malloc((newPatLen + 1) * sizeof(UChar));
    if (pat) {
        patLen = newPatLen;
        newPat.extractBetween(0, patLen, pat);
        pat[patLen] = 0;
    }
    // else we don't care if malloc failed. This was just a nice cache.
    // We can regenerate an equivalent pattern later when requested.
}